

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O0

void __thiscall
UnitTests::Assert::In<int,std::vector<int,std::allocator<int>>&>
          (Assert *this,string *msg,int value,vector<int,_std::allocator<int>_> *container)

{
  int value_00;
  string *msg_00;
  bool bVar1;
  iterator begin;
  iterator end;
  allocator local_69;
  string local_68 [32];
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  int *local_40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  vector<int,_std::allocator<int>_> *local_28;
  vector<int,_std::allocator<int>_> *container_local;
  string *psStack_18;
  int value_local;
  string *msg_local;
  Assert *this_local;
  
  local_28 = container;
  container_local._4_4_ = value;
  psStack_18 = msg;
  msg_local = (string *)this;
  local_38._M_current = (int *)std::begin<std::vector<int,std::allocator<int>>>(container);
  local_40 = (int *)std::end<std::vector<int,std::allocator<int>>>(local_28);
  local_30 = std::find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                       (local_38,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                                 local_40,(int *)((long)&container_local + 4));
  local_48._M_current = (int *)std::end<std::vector<int,std::allocator<int>>>(local_28);
  bVar1 = __gnu_cxx::operator==(&local_30,&local_48);
  msg_00 = psStack_18;
  if (!bVar1) {
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"Expected container to contain",&local_69);
  value_00 = container_local._4_4_;
  begin = std::begin<std::vector<int,std::allocator<int>>>(local_28);
  end = std::end<std::vector<int,std::allocator<int>>>(local_28);
  ContainmentError<int,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (this,msg_00,(string *)local_68,value_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)begin._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)end._M_current);
}

Assistant:

void In(const std::string& msg, Value value, Container&& container) const
        {
            if (std::find(begin(container), end(container), value) == end(container))
            {
                ContainmentError(msg, "Expected container to contain", value, begin(container), end(container));
            }
        }